

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O0

void fy_parse_eventp_recycle(fy_parser *fyp,fy_eventp *fyep)

{
  fy_event *fye;
  fy_eventp *fyep_local;
  fy_parser *fyp_local;
  
  if ((fyp != (fy_parser *)0x0) && (fyep != (fy_eventp *)0x0)) {
    switch((fyep->e).type) {
    case FYET_NONE:
      break;
    case FYET_STREAM_START:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      break;
    case FYET_STREAM_END:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      break;
    case FYET_DOCUMENT_START:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      fy_document_state_unref((fyep->e).field_1.document_start.document_state);
      break;
    case FYET_DOCUMENT_END:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      break;
    case FYET_MAPPING_START:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      fy_token_unref((fyep->e).field_1.scalar.tag);
      fy_token_unref((fyep->e).field_1.scalar.value);
      break;
    case FYET_MAPPING_END:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      break;
    case FYET_SEQUENCE_START:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      fy_token_unref((fyep->e).field_1.scalar.tag);
      fy_token_unref((fyep->e).field_1.scalar.value);
      break;
    case FYET_SEQUENCE_END:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      break;
    case FYET_SCALAR:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
      fy_token_unref((fyep->e).field_1.scalar.tag);
      fy_token_unref((fyep->e).field_1.scalar.value);
      break;
    case FYET_ALIAS:
      fy_token_unref((fyep->e).field_1.document_start.document_start);
    }
    fy_parse_eventp_recycle_simple(fyp,fyep);
  }
  return;
}

Assistant:

void fy_parse_eventp_recycle(struct fy_parser *fyp, struct fy_eventp *fyep) {
    struct fy_event *fye;

    if (!fyp || !fyep)
        return;

    fye = &fyep->e;
    switch (fye->type) {
        case FYET_NONE:
            break;
        case FYET_STREAM_START:
            fy_token_unref(fye->stream_start.stream_start);
            break;
        case FYET_STREAM_END:
            fy_token_unref(fye->stream_end.stream_end);
            break;
        case FYET_DOCUMENT_START:
            fy_token_unref(fye->document_start.document_start);
            fy_document_state_unref(fye->document_start.document_state);
            break;
        case FYET_DOCUMENT_END:
            fy_token_unref(fye->document_end.document_end);
            break;
        case FYET_MAPPING_START:
            fy_token_unref(fye->mapping_start.anchor);
            fy_token_unref(fye->mapping_start.tag);
            fy_token_unref(fye->mapping_start.mapping_start);
            break;
        case FYET_MAPPING_END:
            fy_token_unref(fye->mapping_end.mapping_end);
            break;
        case FYET_SEQUENCE_START:
            fy_token_unref(fye->sequence_start.anchor);
            fy_token_unref(fye->sequence_start.tag);
            fy_token_unref(fye->sequence_start.sequence_start);
            break;
        case FYET_SEQUENCE_END:
            fy_token_unref(fye->sequence_end.sequence_end);
            break;
        case FYET_SCALAR:
            fy_token_unref(fye->scalar.anchor);
            fy_token_unref(fye->scalar.tag);
            fy_token_unref(fye->scalar.value);
            break;
        case FYET_ALIAS:
            fy_token_unref(fye->alias.anchor);
            break;
    }

    fy_parse_eventp_recycle_simple(fyp, fyep);
}